

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5WriteDlidxAppend(Fts5Index *p,Fts5SegWriter *pWriter,i64 iRowid)

{
  int *pRc;
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  undefined1 *iVal;
  byte bVar6;
  Fts5DlidxWriter *pFVar7;
  long lVar8;
  Fts5Buffer *pBuf;
  long lVar9;
  Fts5DlidxWriter *pFVar10;
  long lVar11;
  long in_FS_OFFSET;
  int local_84;
  long local_60;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->rc == 0) {
    pRc = &p->rc;
    local_84 = 2;
    local_60 = 0x1000000000;
    lVar11 = 0;
    lVar9 = 0;
    do {
      pFVar10 = pWriter->aDlidx;
      iVar2 = *(int *)((long)&(pFVar10->buf).n + lVar11);
      iVar3 = p->pConfig->pgsz;
      if (iVar2 < iVar3) {
        pFVar10 = pFVar10 + lVar9;
        bVar5 = true;
      }
      else {
        **(undefined1 **)((long)&(pFVar10->buf).p + lVar11) = 1;
        fts5DataWrite(p,((ulong)(uint)pWriter->iSegid << 0x25) + local_60 +
                        (long)*(int *)((long)&pFVar10->pgno + lVar11),
                      *(u8 **)((long)&(pFVar10->buf).p + lVar11),
                      *(int *)((long)&(pFVar10->buf).n + lVar11));
        fts5WriteDlidxGrow(p,pWriter,local_84);
        pFVar7 = pWriter->aDlidx;
        if ((p->rc == 0) && (*(int *)((long)&pFVar7[1].buf.n + lVar11) == 0)) {
          piVar1 = (int *)((long)&pFVar7->pgno + lVar11);
          pBuf = (Fts5Buffer *)(piVar1 + 0xc);
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          lVar8 = *(long *)(piVar1 + 4);
          bVar6 = sqlite3Fts5GetVarint((uchar *)(lVar8 + 1),(u64 *)&local_40);
          sqlite3Fts5GetVarint((uchar *)(lVar8 + (ulong)bVar6 + 1),(u64 *)&local_40);
          iVal = local_40;
          piVar1[8] = *piVar1;
          sqlite3Fts5BufferAppendVarint(pRc,pBuf,0);
          sqlite3Fts5BufferAppendVarint(pRc,pBuf,(long)*piVar1);
          sqlite3Fts5BufferAppendVarint(pRc,pBuf,(i64)iVal);
          piVar1[9] = 1;
          *(undefined1 **)(piVar1 + 10) = iVal;
        }
        pFVar10 = (Fts5DlidxWriter *)((long)&pFVar7->pgno + lVar11);
        bVar5 = false;
        *(undefined4 *)((long)&(pFVar7->buf).n + lVar11) = 0;
        *(undefined4 *)((long)&pFVar7->bPrevValid + lVar11) = 0;
        piVar1 = (int *)((long)&pFVar7->pgno + lVar11);
        *piVar1 = *piVar1 + 1;
      }
      if (pFVar10->bPrevValid == 0) {
        pFVar7 = pFVar10 + -1;
        if (lVar11 == 0) {
          pFVar7 = (Fts5DlidxWriter *)&pWriter->writer;
        }
        iVar4 = pFVar7->pgno;
        sqlite3Fts5BufferAppendVarint(pRc,&pFVar10->buf,(ulong)(iVar3 <= iVar2));
        sqlite3Fts5BufferAppendVarint(pRc,&pFVar10->buf,(long)iVar4);
        lVar8 = iRowid;
      }
      else {
        lVar8 = iRowid - pFVar10->iPrev;
      }
      sqlite3Fts5BufferAppendVarint(pRc,&pFVar10->buf,lVar8);
      pFVar10->bPrevValid = 1;
      pFVar10->iPrev = iRowid;
      lVar9 = lVar9 + 1;
      local_84 = local_84 + 1;
      lVar11 = lVar11 + 0x20;
      local_60 = local_60 + 0x80000000;
    } while (!bVar5 && *pRc == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts5WriteDlidxAppend(
  Fts5Index *p,
  Fts5SegWriter *pWriter,
  i64 iRowid
){
  int i;
  int bDone = 0;

  for(i=0; p->rc==SQLITE_OK && bDone==0; i++){
    i64 iVal;
    Fts5DlidxWriter *pDlidx = &pWriter->aDlidx[i];

    if( pDlidx->buf.n>=p->pConfig->pgsz ){
      /* The current doclist-index page is full. Write it to disk and push
      ** a copy of iRowid (which will become the first rowid on the next
      ** doclist-index leaf page) up into the next level of the b-tree
      ** hierarchy. If the node being flushed is currently the root node,
      ** also push its first rowid upwards. */
      pDlidx->buf.p[0] = 0x01;    /* Not the root node */
      fts5DataWrite(p,
          FTS5_DLIDX_ROWID(pWriter->iSegid, i, pDlidx->pgno),
          pDlidx->buf.p, pDlidx->buf.n
      );
      fts5WriteDlidxGrow(p, pWriter, i+2);
      pDlidx = &pWriter->aDlidx[i];
      if( p->rc==SQLITE_OK && pDlidx[1].buf.n==0 ){
        i64 iFirst = fts5DlidxExtractFirstRowid(&pDlidx->buf);

        /* This was the root node. Push its first rowid up to the new root. */
        pDlidx[1].pgno = pDlidx->pgno;
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, 0);
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, pDlidx->pgno);
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, iFirst);
        pDlidx[1].bPrevValid = 1;
        pDlidx[1].iPrev = iFirst;
      }

      sqlite3Fts5BufferZero(&pDlidx->buf);
      pDlidx->bPrevValid = 0;
      pDlidx->pgno++;
    }else{
      bDone = 1;
    }

    if( pDlidx->bPrevValid ){
      iVal = (u64)iRowid - (u64)pDlidx->iPrev;
    }else{
      i64 iPgno = (i==0 ? pWriter->writer.pgno : pDlidx[-1].pgno);
      assert( pDlidx->buf.n==0 );
      sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, !bDone);
      sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, iPgno);
      iVal = iRowid;
    }

    sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, iVal);
    pDlidx->bPrevValid = 1;
    pDlidx->iPrev = iRowid;
  }
}